

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O1

void gravity_compiler_transfer(gravity_compiler_t *compiler,gravity_vm *vm)

{
  void_r *pvVar1;
  size_t sVar2;
  gravity_object_t *obj;
  gravity_function_t *f;
  char *__s1;
  int iVar3;
  size_t sVar4;
  
  if (compiler->objects != (void_r *)0x0) {
    gravity_gc_setenabled(vm,false);
    for (sVar4 = compiler->objects->n; sVar4 != 0; sVar4 = sVar4 - 1) {
      pvVar1 = compiler->objects;
      sVar2 = pvVar1->n;
      pvVar1->n = sVar2 - 1;
      obj = (gravity_object_t *)pvVar1->p[sVar2 - 1];
      gravity_vm_transfer(vm,obj);
      if (obj->isa == gravity_class_closure) {
        f = (gravity_function_t *)obj->identifier;
        __s1 = f->identifier;
        if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,"$moduleinit"), iVar3 == 0)) {
          gravity_vm_initmodule(vm,f);
        }
      }
    }
    gravity_gc_setenabled(vm,true);
    return;
  }
  return;
}

Assistant:

void gravity_compiler_transfer(gravity_compiler_t *compiler, gravity_vm *vm) {
    if (!compiler->objects) return;

    // transfer each object from compiler mini VM to exec VM
    gravity_gc_setenabled(vm, false);
    size_t count = marray_size(*compiler->objects);
    for (size_t i=0; i<count; ++i) {
        gravity_object_t *obj = marray_pop(*compiler->objects);
        gravity_vm_transfer(vm, obj);
        if (!OBJECT_ISA_CLOSURE(obj)) continue;

        // $moduleinit closure needs to be explicitly initialized
        gravity_closure_t *closure = (gravity_closure_t *)obj;
        if ((closure->f->identifier) && strcmp(closure->f->identifier, INITMODULE_NAME) == 0) {
            // code is here because it does not make sense to add this overhead (that needs to be executed only once)
            // inside the gravity_vm_transfer callback which is called for each allocated object inside the VM
            gravity_vm_initmodule(vm, closure->f);
        }
    }

    gravity_gc_setenabled(vm, true);
}